

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TimeScaleDirectiveSyntax::setChild
          (TimeScaleDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  Token *pTVar1;
  undefined8 uVar2;
  Token TVar3;
  
  TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
  uVar2 = TVar3._0_8_;
  pTVar1 = &(this->super_DirectiveSyntax).directive + index;
  pTVar1->kind = (short)uVar2;
  pTVar1->field_0x2 = (char)((ulong)uVar2 >> 0x10);
  pTVar1->numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
  pTVar1->rawLen = (int)((ulong)uVar2 >> 0x20);
  (&(this->super_DirectiveSyntax).directive)[index].info = TVar3.info;
  return;
}

Assistant:

void TimeScaleDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        case 1: timeUnit = child.token(); return;
        case 2: slash = child.token(); return;
        case 3: timePrecision = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}